

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary16::writer<std::wostream>
          (binary16 *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  byte bVar1;
  byte *pbVar2;
  wostream *pwVar3;
  uint uVar4;
  const_iterator __begin3;
  byte *pbVar5;
  uint uVar6;
  array<wchar_t,_3UL> hex;
  
  std::operator<<(os,"!!binary16 |");
  pbVar5 = *(byte **)&this->v_;
  pbVar2 = *(byte **)&this->field_0x10;
  if (pbVar5 == pbVar2) {
    pwVar3 = std::operator<<(os,'\n');
    operator<<(pwVar3,ind);
  }
  else {
    uVar4 = 0;
    for (; pbVar5 != pbVar2; pbVar5 = pbVar5 + 1) {
      bVar1 = *pbVar5;
      if (uVar4 - 0x10 < 0xfffffff1) {
        pwVar3 = std::operator<<(os,'\n');
        operator<<(pwVar3,ind);
        uVar4 = 0;
      }
      else if ((uVar4 & 1) == 0) {
        std::operator<<(os,' ');
      }
      hex._M_elems[0] = bVar1 >> 4 | 0x30;
      if (0x9f < bVar1) {
        hex._M_elems[0] = (uint)(bVar1 >> 4) + L'7';
      }
      uVar6 = bVar1 & 0xf;
      hex._M_elems[1] = uVar6 + L'0';
      if (9 < uVar6) {
        hex._M_elems[1] = uVar6 + L'7';
      }
      hex._M_elems[2] = L'\0';
      std::operator<<(os,hex._M_elems);
      uVar4 = uVar4 + 1;
    }
  }
  pwVar3 = std::operator<<(os,'>');
  return pwVar3;
}

Assistant:

OStream & binary16::writer (OStream & os, indent const & ind) const {
            os << "!!binary16 |";
            if (v_.empty ()) {
                os << '\n' << ind;
            } else {
                using char_type = typename OStream::char_type;
                constexpr auto bytes_per_row = 8U * 2U;
                auto byte_no = 0U;
                for (std::uint8_t const b : v_) {
                    if (byte_no == 0U || byte_no >= bytes_per_row) {
                        // Line wrap and indent on the first iteration or when we run out of width.
                        os << '\n' << ind;
                        byte_no = 0U;
                    } else if (byte_no % 2U == 0U) {
                        // Values grouped into two-byte pairs.
                        os << ' ';
                    }
                    std::array<char_type, 3> const hex{{to_hex<char_type> ((b >> 4U) & 0x0FU),
                                                        to_hex<char_type> (b & 0x0FU), '\0'}};
                    os << hex.data ();
                    ++byte_no;
                }
            }
            return os << '>';
        }